

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableHandler.hpp
# Opt level: O2

Waveform * __thiscall
trackerboy::TableHandler<trackerboy::Waveform,_1163280727U>::initItem
          (TableHandler<trackerboy::Waveform,_1163280727U> *this,InputBlock *block,
          Table<trackerboy::Waveform> *table)

{
  Waveform *pWVar1;
  InputBlock *block_00;
  uint8_t id;
  byte local_39;
  string local_38;
  
  InputBlock::read<unsigned_char>(block,&local_39);
  pWVar1 = Table<trackerboy::Waveform>::operator[](table,(uint)local_39);
  if (pWVar1 == (Waveform *)0x0) {
    pWVar1 = Table<trackerboy::Waveform>::insert(table,(uint)local_39);
    deserializeString_abi_cxx11_(&local_38,(trackerboy *)block,block_00);
    Named::setName(&pWVar1->super_Named,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    pWVar1 = (Waveform *)0x0;
  }
  return pWVar1;
}

Assistant:

T* initItem(InputBlock &block, Table<T> &table) {
        uint8_t id;
        block.read(id);

        if (table[id] != nullptr) {
            return nullptr;
        }

        auto item = table.insert(id);
        item->setName(deserializeString(block));
        return item;
    }